

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O2

void __thiscall
QPlainTestLogger::printBenchmarkResultsHeader(QPlainTestLogger *this,QBenchmarkResult *result)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  reference pvVar4;
  char *args;
  size_t __n;
  size_type sVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_478;
  QArrayDataPointer<char> local_458;
  size_type local_438;
  array<char,_1024UL> local_430;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_430,0xaa,0x400);
  local_438 = 0;
  local_430._M_elems[0] = '\0';
  pcVar2 = QTestResult::currentTestObjectName();
  QString::toLatin1_helper((QString *)&local_458);
  pcVar3 = QByteArray::data((QByteArray *)&local_458);
  iVar1 = snprintf(local_430._M_elems,0x3ff,"%s: %s::%s","RESULT ",pcVar2,pcVar3);
  sVar5 = (long)iVar1 + local_438;
  local_438 = sVar5;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_458);
  local_458.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_458.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_458.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = QTestResult::currentDataTag();
  QByteArray::QByteArray((QByteArray *)&local_458,pcVar2,-1);
  local_478.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_478.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_478.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = QTestResult::currentGlobalDataTag();
  QByteArray::QByteArray((QByteArray *)&local_478,pcVar2,-1);
  if ((undefined1 *)local_478.size == (undefined1 *)0x0) {
    if ((undefined1 *)local_458.size == (undefined1 *)0x0) {
      __n = 2;
      if (0x3fe - sVar5 < 2) {
        __n = 0x3fe - sVar5;
      }
      memcpy(local_430._M_elems + sVar5,":\n",__n);
      local_438 = __n + local_438;
      pvVar4 = std::array<char,_1024UL>::operator[](&local_430,local_438);
      *pvVar4 = '\0';
      goto LAB_0011dbc7;
    }
    pcVar2 = local_458.ptr;
    if (local_458.ptr == (char *)0x0) {
      pcVar2 = (char *)&QByteArray::_empty;
    }
  }
  else {
    pcVar2 = local_478.ptr;
    if (local_478.ptr == (char *)0x0) {
      pcVar2 = (char *)&QByteArray::_empty;
    }
    if ((undefined1 *)local_458.size != (undefined1 *)0x0) {
      pcVar3 = local_458.ptr;
      if (local_458.ptr == (char *)0x0) {
        pcVar3 = (char *)&QByteArray::_empty;
      }
      iVar1 = snprintf(local_430._M_elems + sVar5,0x3ff - sVar5,":\"%s:%s\":\n",pcVar2,pcVar3);
      local_438 = local_438 + (long)iVar1;
      goto LAB_0011dbc7;
    }
  }
  (anonymous_namespace)::FixedBufString<1022>::appendf<char_const*>
            ((FixedBufString<1022> *)&local_438,pcVar2,args);
LAB_0011dbc7:
  QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,local_430._M_elems);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_478);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_458);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTestLogger::printBenchmarkResultsHeader(const QBenchmarkResult &result)
{
    FixedBufString<1022> buf;
    buf.appendf("%s: %s::%s", QTest::benchmarkResult2String(),
                QTestResult::currentTestObjectName(), result.context.slotName.toLatin1().data());

    QByteArray tag = QTestResult::currentDataTag();
    QByteArray gtag = QTestResult::currentGlobalDataTag();

    if (!gtag.isEmpty() && !tag.isEmpty())
        buf.appendf(":\"%s:%s\":\n", gtag.constData(), tag.constData());
    else if (!gtag.isEmpty())
        buf.appendf(":\"%s\":\n", gtag.constData());
    else if (!tag.isEmpty())
        buf.appendf(":\"%s\":\n", tag.constData());
    else
        buf.append(":\n");
    outputMessage(buf);
}